

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::DebugDocument_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::RemoveAt(BaseDictionary<unsigned_int,_Js::DebugDocument_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int i,int last,uint targetBucket)

{
  int iVar1;
  Type pSVar2;
  
  pSVar2 = this->entries;
  iVar1 = pSVar2[i].
          super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
          super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
          .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.next;
  if (last < 0) {
    this->buckets[targetBucket] = iVar1;
  }
  else {
    pSVar2[(uint)last].
    super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
    super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
    .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.next = iVar1;
  }
  pSVar2[i].
  super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
  super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
  .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.value = (DebugDocument *)0x0;
  pSVar2[i].
  super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
  super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
  .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.key = 0;
  SetNextFreeEntryIndex(this,this->entries + i,-(uint)(this->freeCount == 0) | this->freeList);
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Remove(this->stats,this->buckets[targetBucket] == -1);
    return;
  }
  return;
}

Assistant:

inline void RemoveAt(const int i, const int last, const uint targetBucket)
        {
            if (last < 0)
            {
                buckets[targetBucket] = entries[i].next;
            }
            else
            {
                entries[last].next = entries[i].next;
            }
            entries[i].Clear();
            SetNextFreeEntryIndex(entries[i], freeCount == 0 ? -1 : freeList);
            freeList = i;
            freeCount++;
#if PROFILE_DICTIONARY
            if (stats)
                stats->Remove(buckets[targetBucket] == -1);
#endif
        }